

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cc
# Opt level: O3

shared_ptr<dh::symTab> __thiscall dh::symTab::get_upptr_tab(symTab *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  shared_ptr<dh::symTab> sVar2;
  shared_ptr<dh::symTab> sVar3;
  
  *(element_type **)in_RDI =
       (this->upper_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1 = (element_type *)
           (this->upper_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (in_RDI->upper_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  if (peVar1 != (element_type *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      *(int *)&(peVar1->upper_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = *(int *)&(peVar1->upper_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 1;
      sVar2.super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar2.super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (shared_ptr<dh::symTab>)
             sVar2.super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    *(int *)&(peVar1->upper_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(int *)&(peVar1->upper_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 1;
    UNLOCK();
  }
  sVar3.super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar3.super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<dh::symTab>)sVar3.super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

::std::shared_ptr<symTab> symTab::get_upptr_tab()
{
	return this->upper_tab;
}